

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

bool * __thiscall
google::protobuf::Reflection::GetRawSplit<bool>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  void *pvVar4;
  bool *pbVar5;
  LogMessage *this_00;
  LogMessage aLStack_38 [16];
  
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    pvVar4 = GetSplitField(this,message);
    uVar2 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    bVar1 = FieldDescriptor::is_repeated(field);
    pbVar5 = (bool *)((ulong)uVar2 + (long)pvVar4);
    if (bVar1) {
      pbVar5 = *(bool **)pbVar5;
    }
    return pbVar5;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message.h"
             ,0x642,0x1b,"!schema_.InRealOneof(field)");
  this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<
                      (aLStack_38,(char (*) [9])"Field = ");
  absl::lts_20240722::log_internal::LogMessage::operator<<
            (this_00,(string *)(field->all_names_ + 1));
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}